

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimingControl.cpp
# Opt level: O0

int slang::ast::TimingControl::bind(int __fd,sockaddr *__addr,socklen_t __len)

{
  SyntaxKind SVar1;
  SourceRange sourceRange;
  bool bVar2;
  Compilation *syntax;
  bitmask<slang::ast::ASTFlags> context;
  undefined4 in_register_0000003c;
  SyntaxNode *this;
  TimingControl *result;
  ASTContext ctx;
  Compilation *comp;
  TimingControl *in_stack_fffffffffffffef8;
  Compilation *in_stack_ffffffffffffff00;
  ASTContext *in_stack_ffffffffffffff08;
  BumpAllocator *in_stack_ffffffffffffff10;
  ImplicitEventControlSyntax *in_stack_ffffffffffffff18;
  SourceLocation in_stack_ffffffffffffff20;
  SourceLocation in_stack_ffffffffffffff28;
  undefined8 in_stack_ffffffffffffff30;
  DiagCode code;
  ASTContext *in_stack_ffffffffffffff50;
  ASTContext *context_00;
  undefined7 in_stack_ffffffffffffff60;
  undefined1 uVar3;
  Compilation *in_stack_ffffffffffffff68;
  ASTContext *in_stack_ffffffffffffff78;
  bitmask<slang::ast::ASTFlags> in_stack_ffffffffffffff80;
  Compilation *compilation;
  Delay3Syntax *syntax_00;
  bitmask<slang::ast::ASTFlags> compilation_00;
  ASTContext *context_01;
  RepeatedEventControlSyntax *syntax_01;
  Compilation *compilation_01;
  TimingControl *local_8;
  
  code = SUB84((ulong)in_stack_ffffffffffffff30 >> 0x20,0);
  this = (SyntaxNode *)CONCAT44(in_register_0000003c,__fd);
  syntax = ASTContext::getCompilation((ASTContext *)0xa26084);
  context_00 = (ASTContext *)&((Compilation *)__addr)->options;
  context = ast::operator|((ASTFlags)in_stack_ffffffffffffff08,(ASTFlags)in_stack_ffffffffffffff00);
  bVar2 = bitmask<slang::ast::ASTFlags>::has
                    ((bitmask<slang::ast::ASTFlags> *)in_stack_ffffffffffffff10,
                     (bitmask<slang::ast::ASTFlags> *)in_stack_ffffffffffffff08);
  uVar3 = true;
  if (!bVar2) {
    uVar3 = ASTContext::inAlwaysCombLatch(in_stack_ffffffffffffff08);
  }
  if ((bool)uVar3 == false) {
    compilation_01 = *(Compilation **)&(((Compilation *)__addr)->options).maxInstanceArray;
    compilation = (Compilation *)(((Compilation *)__addr)->super_BumpAllocator).head;
    syntax_00 = (Delay3Syntax *)(((Compilation *)__addr)->super_BumpAllocator).endPtr;
    compilation_00.m_bits = *(underlying_type *)&((Compilation *)__addr)->options;
    context_01 = *(ASTContext **)&(((Compilation *)__addr)->options).maxConstexprDepth;
    syntax_01 = *(RepeatedEventControlSyntax **)
                 &(((Compilation *)__addr)->options).maxConstexprBacktrace;
    bitmask<slang::ast::ASTFlags>::bitmask
              ((bitmask<slang::ast::ASTFlags> *)&stack0xffffffffffffff80,AssignmentDisallowed);
    bitmask<slang::ast::ASTFlags>::operator|=
              ((bitmask<slang::ast::ASTFlags> *)&stack0xffffffffffffff98,
               (bitmask<slang::ast::ASTFlags> *)&stack0xffffffffffffff80);
    SVar1 = this->kind;
    if (SVar1 == CycleDelay) {
      slang::syntax::SyntaxNode::as<slang::syntax::DelaySyntax>(this);
      local_8 = CycleDelayControl::fromSyntax
                          (compilation,(DelaySyntax *)in_stack_ffffffffffffff80.m_bits,
                           in_stack_ffffffffffffff78);
    }
    else if (SVar1 == Delay3) {
      slang::syntax::SyntaxNode::as<slang::syntax::Delay3Syntax>(this);
      local_8 = Delay3Control::fromSyntax
                          ((Compilation *)compilation_00.m_bits,syntax_00,(ASTContext *)compilation)
      ;
    }
    else if (SVar1 == DelayControl) {
      slang::syntax::SyntaxNode::as<slang::syntax::DelaySyntax>(this);
      local_8 = DelayControl::fromSyntax
                          (in_stack_ffffffffffffff68,
                           (DelaySyntax *)CONCAT17(uVar3,in_stack_ffffffffffffff60),context_00);
    }
    else if (SVar1 == EventControl) {
      slang::syntax::SyntaxNode::as<slang::syntax::EventControlSyntax>(this);
      local_8 = SignalEventControl::fromSyntax
                          ((Compilation *)CONCAT17(uVar3,in_stack_ffffffffffffff60),
                           (EventControlSyntax *)context_00,in_stack_ffffffffffffff50);
    }
    else if (SVar1 == EventControlWithExpression) {
      slang::syntax::SyntaxNode::as<slang::syntax::EventControlWithExpressionSyntax>(this);
      not_null<slang::syntax::EventExpressionSyntax_*>::operator*
                ((not_null<slang::syntax::EventExpressionSyntax_*> *)0xa26328);
      local_8 = EventListControl::fromSyntax
                          ((Compilation *)__addr,(SyntaxNode *)syntax,(ASTContext *)context.m_bits);
    }
    else if (SVar1 == ImplicitEventControl) {
      slang::syntax::SyntaxNode::as<slang::syntax::ImplicitEventControlSyntax>(this);
      local_8 = ImplicitEventControl::fromSyntax
                          ((Compilation *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                           (ASTContext *)syntax);
    }
    else if (SVar1 == OneStepDelay) {
      slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)in_stack_ffffffffffffff50);
      local_8 = &BumpAllocator::emplace<slang::ast::OneStepDelayControl,slang::SourceRange>
                           (in_stack_ffffffffffffff10,(SourceRange *)in_stack_ffffffffffffff08)->
                 super_TimingControl;
    }
    else {
      slang::syntax::SyntaxNode::as<slang::syntax::RepeatedEventControlSyntax>(this);
      local_8 = RepeatedEventControl::fromSyntax(compilation_01,syntax_01,context_01);
    }
    local_8->syntax = this;
  }
  else {
    slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)__addr);
    sourceRange.endLoc = in_stack_ffffffffffffff28;
    sourceRange.startLoc = in_stack_ffffffffffffff20;
    ASTContext::addDiag((ASTContext *)in_stack_ffffffffffffff18,code,sourceRange);
    local_8 = badCtrl(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  }
  return (int)local_8;
}

Assistant:

TimingControl& TimingControl::bind(const TimingControlSyntax& syntax, const ASTContext& context) {
    auto& comp = context.getCompilation();
    if (context.flags.has(ASTFlags::Function | ASTFlags::Final) || context.inAlwaysCombLatch()) {
        context.addDiag(diag::TimingInFuncNotAllowed, syntax.sourceRange());
        return badCtrl(comp, nullptr);
    }

    ASTContext ctx(context);
    ctx.flags |= ASTFlags::AssignmentDisallowed;

    TimingControl* result;
    switch (syntax.kind) {
        case SyntaxKind::DelayControl:
            result = &DelayControl::fromSyntax(comp, syntax.as<DelaySyntax>(), ctx);
            break;
        case SyntaxKind::Delay3:
            result = &Delay3Control::fromSyntax(comp, syntax.as<Delay3Syntax>(), ctx);
            break;
        case SyntaxKind::EventControl:
            result = &SignalEventControl::fromSyntax(comp, syntax.as<EventControlSyntax>(), ctx);
            break;
        case SyntaxKind::EventControlWithExpression:
            result = &EventListControl::fromSyntax(
                comp, *syntax.as<EventControlWithExpressionSyntax>().expr, ctx);
            break;
        case SyntaxKind::ImplicitEventControl:
            result = &ImplicitEventControl::fromSyntax(comp,
                                                       syntax.as<ImplicitEventControlSyntax>(),
                                                       ctx);
            break;
        case SyntaxKind::RepeatedEventControl:
            result = &RepeatedEventControl::fromSyntax(comp,
                                                       syntax.as<RepeatedEventControlSyntax>(),
                                                       ctx);
            break;
        case SyntaxKind::OneStepDelay:
            result = comp.emplace<OneStepDelayControl>(syntax.sourceRange());
            break;
        case SyntaxKind::CycleDelay:
            result = &CycleDelayControl::fromSyntax(comp, syntax.as<DelaySyntax>(), ctx);
            break;
        default:
            SLANG_UNREACHABLE;
    }

    result->syntax = &syntax;
    return *result;
}